

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlContext::~GlContext(GlContext *this)

{
  GlContext *value;
  GlContext *in_RDI;
  
  in_RDI->_vptr_GlContext = (_func_int **)&PTR__GlContext_002bc918;
  if (((anonymous_namespace)::GlContextImpl::sharedContext != 0) &&
     (value = ThreadLocalPtr::operator_cast_to_GlContext_
                        ((ThreadLocalPtr<sf::priv::GlContext> *)0x221ce7), in_RDI == value)) {
    ThreadLocalPtr<sf::priv::GlContext>::operator=
              ((ThreadLocalPtr<sf::priv::GlContext> *)in_RDI,value);
  }
  NonCopyable::~NonCopyable((NonCopyable *)in_RDI);
  return;
}

Assistant:

GlContext::~GlContext()
{
    using GlContextImpl::currentContext;
    using GlContextImpl::sharedContext;

    // Deactivate the context before killing it, unless we're inside Cleanup()
    if (sharedContext)
    {
        if (this == currentContext)
            currentContext = NULL;
    }
}